

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall
CEditor::InvokeFileDialog
          (CEditor *this,int StorageType,int FileType,char *pTitle,char *pButtonText,char *pBasePath
          ,char *pDefaultName,_func_void_char_ptr_int_void_ptr *pfnFunc,void *pUser)

{
  this->m_FileDialogStorageType = StorageType;
  this->m_pFileDialogTitle = pTitle;
  this->m_pFileDialogButtonText = pButtonText;
  this->m_pfnFileDialogFunc = pfnFunc;
  this->m_pFileDialogUser = pUser;
  this->m_aFileDialogFileName[0] = '\0';
  this->m_aFileDialogCurrentFolder[0] = '\0';
  this->m_aFileDialogCurrentLink[0] = '\0';
  this->m_aFileDialogFilterString[0] = '\0';
  this->m_pFileDialogPath = this->m_aFileDialogCurrentFolder;
  this->m_FileDialogFileType = FileType;
  this->m_FileDialogScrollValue = 0.0;
  (this->m_UI).m_ActiveItemValid = true;
  (this->m_UI).m_pActiveItem = &this->m_FileDialogFilterInput;
  (this->m_UI).m_pLastActiveItem = &this->m_FileDialogFilterInput;
  this->m_PreviewImageIsLoaded = false;
  if (pDefaultName != (char *)0x0) {
    str_copy(this->m_aFileDialogFileName,pDefaultName,0x200);
  }
  if (pBasePath != (char *)0x0) {
    str_copy(this->m_aFileDialogCurrentFolder,pBasePath,0x200);
  }
  FilelistPopulate(this,this->m_FileDialogStorageType);
  this->m_Dialog = 1;
  return;
}

Assistant:

void CEditor::InvokeFileDialog(int StorageType, int FileType, const char *pTitle, const char *pButtonText,
	const char *pBasePath, const char *pDefaultName,
	void (*pfnFunc)(const char *pFileName, int StorageType, void *pUser), void *pUser)
{
	m_FileDialogStorageType = StorageType;
	m_pFileDialogTitle = pTitle;
	m_pFileDialogButtonText = pButtonText;
	m_pfnFileDialogFunc = pfnFunc;
	m_pFileDialogUser = pUser;
	m_aFileDialogFileName[0] = 0;
	m_aFileDialogCurrentFolder[0] = 0;
	m_aFileDialogCurrentLink[0] = 0;
	m_aFileDialogFilterString[0] = 0;
	m_pFileDialogPath = m_aFileDialogCurrentFolder;
	m_FileDialogFileType = FileType;
	m_FileDialogScrollValue = 0.0f;
	UI()->SetActiveItem(&m_FileDialogFilterInput);
	m_PreviewImageIsLoaded = false;

	if(pDefaultName)
		str_copy(m_aFileDialogFileName, pDefaultName, sizeof(m_aFileDialogFileName));
	if(pBasePath)
		str_copy(m_aFileDialogCurrentFolder, pBasePath, sizeof(m_aFileDialogCurrentFolder));

	FilelistPopulate(m_FileDialogStorageType);

	m_Dialog = DIALOG_FILE;
}